

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

void __thiscall llvm::AppleAcceleratorTable::dump(AppleAcceleratorTable *this,raw_ostream *OS)

{
  ScopedPrinter *pSVar1;
  ushort *puVar2;
  char *pcVar3;
  StringRef N;
  StringRef N_00;
  StringRef N_01;
  undefined8 uVar4;
  NodeKind NVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  raw_ostream *prVar10;
  ulong uVar11;
  size_t __n;
  Child RHS;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  Child LHS;
  Child LHS_00;
  Child LHS_01;
  NodeKind RHSKind;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  StringRef Label;
  StringRef Str;
  StringRef Str_00;
  StringRef Fmt;
  StringRef Value;
  StringRef Value_00;
  StringRef N_02;
  StringRef SVar15;
  undefined1 local_1e8 [8];
  SmallVector<llvm::DWARFFormValue,_3U> AtomForms;
  ScopedPrinter W;
  uint64_t HashOffset;
  uint64_t OffsetsOffset;
  undefined **local_110;
  DelimitedScope<_[_,__]_> local_108;
  ListScope BucketScope;
  uint64_t DataOffset;
  ListScope HashScope;
  ListScope AtomsScope;
  NodeKind local_e0;
  NodeKind NStack_df;
  undefined6 uStack_de;
  undefined1 local_d8 [32];
  DWARFUnit *local_b8;
  DWARFContext *pDStack_b0;
  pointer local_a0;
  Child local_88;
  ushort *local_80;
  DelimitedScope<___,____> local_78;
  uint64_t Offset;
  Child CStack_68;
  NodeKind local_60;
  NodeKind NStack_5f;
  undefined6 uStack_5e;
  void *local_58;
  Child local_50;
  Child local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (this->IsValid == true) {
    pSVar1 = (ScopedPrinter *)
             (AtomForms.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts[2].buffer +
             0x28);
    W.OS._0_4_ = 0;
    W.IndentLevel = 0;
    W._12_4_ = 0;
    W.Prefix.Data = (char *)0x0;
    AtomForms.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts[2].buffer._40_8_ = OS;
    Header::dump(&this->Hdr,pSVar1);
    SVar15.Length = 0xf;
    SVar15.Data = "DIE offset base";
    ScopedPrinter::printNumber(pSVar1,SVar15,(this->HdrData).DIEOffsetBase);
    Label.Length = 0xf;
    Label.Data = "Number of atoms";
    ScopedPrinter::printNumber
              (pSVar1,Label,
               (ulong)(this->HdrData).Atoms.
                      super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                      super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>
                      .
                      super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                      .super_SmallVectorBase.Size);
    local_1e8 = (undefined1  [8])
                &AtomForms.super_SmallVectorImpl<llvm::DWARFFormValue>.
                 super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                 super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
                 Size;
    AtomForms.super_SmallVectorImpl<llvm::DWARFFormValue>.
    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         (void *)0x300000000;
    N_02.Length = 5;
    N_02.Data = "Atoms";
    DelimitedScope<'[',_']'>::DelimitedScope(&HashScope,pSVar1,N_02);
    uVar12 = (ulong)(this->HdrData).Atoms.
                    super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                    super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>
                    .
                    super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                    .super_SmallVectorBase.Size;
    if (uVar12 != 0) {
      local_58 = (this->HdrData).Atoms.
                 super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                 super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
                 super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                 .super_SmallVectorBase.BeginX;
      local_80 = (ushort *)((long)local_58 + uVar12 * 4);
      local_50.twine = (Twine *)0x0;
      local_110 = &PTR_home_01077fa8;
      local_88.twine = (Twine *)&PTR_anchor_01077dc8;
      do {
        Twine::Twine((Twine *)&Offset,"Atom ");
        if (local_60 == EmptyKind) {
          local_48 = local_50;
          local_38 = CONCAT71(local_38._1_7_,9);
LAB_00d490f0:
          uStack_40 = (Form *)0x0;
          local_38._0_2_ = CONCAT11(1,(undefined1)local_38);
        }
        else {
          if (local_60 == NullKind) {
            local_48.twine = (Twine *)0x0;
            local_38 = (ulong)local_38._1_7_ << 8;
            goto LAB_00d490f0;
          }
          NVar5 = local_60;
          if (NStack_5f != EmptyKind) {
            NVar5 = TwineKind;
          }
          LHS._4_4_ = Offset._4_4_;
          LHS.decUI = (undefined4)Offset;
          if (NStack_5f != EmptyKind) {
            LHS.twine = (Twine *)&Offset;
          }
          Twine::Twine((Twine *)&local_48,LHS,NVar5,local_50,DecUIKind);
        }
        Twine::str_abi_cxx11_((string *)local_d8,(Twine *)&local_48);
        N.Data._2_6_ = local_d8._2_6_;
        N.Data._0_2_ = local_d8._0_2_;
        N.Length = local_d8._8_8_;
        DelimitedScope<'{',_'}'>::DelimitedScope
                  (&local_78,
                   (ScopedPrinter *)
                   (AtomForms.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts[2].
                    buffer + 0x28),N);
        if ((undefined1 *)CONCAT62(local_d8._2_6_,local_d8._0_2_) != local_d8 + 0x10) {
          operator_delete((undefined1 *)CONCAT62(local_d8._2_6_,local_d8._0_2_),local_d8._16_8_ + 1)
          ;
        }
        ScopedPrinter::printIndent
                  ((ScopedPrinter *)
                   (AtomForms.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts[2].
                    buffer + 0x28));
        Str.Length = 6;
        Str.Data = "Type: ";
        prVar10 = raw_ostream::operator<<
                            ((raw_ostream *)
                             AtomForms.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts
                             [2].buffer._40_8_,Str);
        uVar4 = local_d8._16_8_;
        puVar2 = (ushort *)((long)local_58 + (long)local_50.twine * 4);
        local_d8._18_2_ = 0;
        local_d8._16_2_ = *puVar2;
        uVar9 = local_d8._16_4_;
        local_d8._16_8_ = uVar4;
        SVar15 = dwarf::AtomTypeString((uint)*puVar2);
        if (SVar15.Length == 0) {
          __n = (long)prVar10->OutBufEnd - (long)prVar10->OutBufCur;
          if (__n < 0x10) {
            prVar10 = (raw_ostream *)raw_ostream::write(prVar10,0xe56f73,(void *)0x10,__n);
          }
          else {
            builtin_strncpy(prVar10->OutBufCur,"DW_ATOM_unknown_",0x10);
            prVar10->OutBufCur = prVar10->OutBufCur + 0x10;
          }
          local_d8._8_8_ = "%x";
          local_d8._0_2_ = SUB82(local_110,0);
          local_d8._2_6_ = (undefined6)((ulong)local_110 >> 0x10);
          local_d8._16_8_ = CONCAT44(local_d8._20_4_,uVar9);
          prVar10 = raw_ostream::operator<<(prVar10,(format_object_base *)local_d8);
          __buf = extraout_RDX_00;
        }
        else {
          prVar10 = raw_ostream::operator<<(prVar10,SVar15);
          __buf = extraout_RDX;
        }
        pcVar3 = prVar10->OutBufCur;
        if (pcVar3 < prVar10->OutBufEnd) {
          prVar10->OutBufCur = pcVar3 + 1;
          *pcVar3 = '\n';
        }
        else {
          raw_ostream::write(prVar10,10,__buf,(size_t)pcVar3);
        }
        ScopedPrinter::printIndent
                  ((ScopedPrinter *)
                   (AtomForms.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts[2].
                    buffer + 0x28));
        Str_00.Length = 6;
        Str_00.Data = "Form: ";
        prVar10 = raw_ostream::operator<<
                            ((raw_ostream *)
                             AtomForms.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts
                             [2].buffer._40_8_,Str_00);
        local_48 = local_88;
        Fmt.Length = 3;
        Fmt.Data = "{0}";
        uStack_40 = puVar2 + 1;
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Form_&>_>_>
        ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Form_&>_>_>
                          *)local_d8,Fmt,
                         (tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Form_&>_> *
                         )&local_48);
        prVar10 = raw_ostream::operator<<(prVar10,(formatv_object_base *)local_d8);
        pcVar3 = prVar10->OutBufCur;
        if (pcVar3 < prVar10->OutBufEnd) {
          prVar10->OutBufCur = pcVar3 + 1;
          *pcVar3 = '\n';
        }
        else {
          raw_ostream::write(prVar10,10,__buf_00,(size_t)pcVar3);
        }
        if (pDStack_b0 != (DWARFContext *)0x0) {
          operator_delete(pDStack_b0,(long)local_a0 - (long)pDStack_b0);
        }
        if ((void *)local_d8._16_8_ != (void *)0x0) {
          operator_delete((void *)local_d8._16_8_,(long)local_b8 - local_d8._16_8_);
        }
        local_d8._0_2_ = puVar2[1];
        local_d8._8_8_ = (char *)0x0;
        local_d8._16_8_ = (void *)0x0;
        local_b8 = (DWARFUnit *)0x0;
        pDStack_b0 = (DWARFContext *)0x0;
        SmallVectorTemplateBase<llvm::DWARFFormValue,_true>::push_back
                  ((SmallVectorTemplateBase<llvm::DWARFFormValue,_true> *)local_1e8,
                   (DWARFFormValue *)local_d8);
        DelimitedScope<'{',_'}'>::~DelimitedScope(&local_78);
        local_50.twine = (Twine *)((long)&(local_50.twine)->LHS + 1);
      } while (puVar2 + 2 != local_80);
    }
    DelimitedScope<'[',_']'>::~DelimitedScope(&HashScope);
    uVar12 = (ulong)(this->Hdr).HeaderDataLength;
    local_78.W = (ScopedPrinter *)(uVar12 + 0x14);
    uVar7 = (this->Hdr).BucketCount;
    if (uVar7 != 0) {
      local_80 = (ushort *)(uVar12 + (uVar7 << 2) + 0x14);
      local_88.twine = (Twine *)((ulong)((this->Hdr).HashCount << 2) + (long)local_80);
      local_50.twine = (Twine *)&(this->super_DWARFAcceleratorTable).AccelSection;
      local_58 = (void *)0x0;
      pSVar1 = (ScopedPrinter *)
               (AtomForms.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts[2].buffer +
               0x28);
      do {
        uVar7 = DataExtractor::getU32
                          ((DataExtractor *)local_50.twine,(uint64_t *)&local_78,(Error *)0x0);
        Twine::Twine((Twine *)&Offset,"Bucket ");
        if (local_60 == EmptyKind) {
          local_38 = CONCAT71(local_38._1_7_,9);
          local_48.twine = (Twine *)((ulong)local_58 & 0xffffffff);
LAB_00d49401:
          uStack_40 = (Form *)0x0;
          local_38._0_2_ = CONCAT11(1,(undefined1)local_38);
        }
        else {
          if (local_60 == NullKind) {
            local_48.twine = (Twine *)0x0;
            local_38 = (ulong)local_38._1_7_ << 8;
            goto LAB_00d49401;
          }
          NVar5 = local_60;
          if (NStack_5f != EmptyKind) {
            NVar5 = TwineKind;
          }
          LHS_00._4_4_ = Offset._4_4_;
          LHS_00.decUI = (undefined4)Offset;
          if (NStack_5f != EmptyKind) {
            LHS_00.twine = (Twine *)&Offset;
          }
          Twine::Twine((Twine *)&local_48,LHS_00,NVar5,(Twine *)((ulong)local_58 & 0xffffffff),
                       DecUIKind);
        }
        Twine::str_abi_cxx11_((string *)local_d8,(Twine *)&local_48);
        N_00.Data._2_6_ = local_d8._2_6_;
        N_00.Data._0_2_ = local_d8._0_2_;
        N_00.Length = local_d8._8_8_;
        DelimitedScope<'[',_']'>::DelimitedScope(&local_108,pSVar1,N_00);
        if ((undefined1 *)CONCAT62(local_d8._2_6_,local_d8._0_2_) != local_d8 + 0x10) {
          operator_delete((undefined1 *)CONCAT62(local_d8._2_6_,local_d8._0_2_),local_d8._16_8_ + 1)
          ;
        }
        if (uVar7 == 0xffffffff) {
          Value_00.Length = 5;
          Value_00.Data = "EMPTY";
          ScopedPrinter::printString(pSVar1,Value_00);
        }
        else if (uVar7 < (this->Hdr).HashCount) {
          uVar12 = (ulong)uVar7;
          do {
            uVar11 = (ulong)(uint)((int)uVar12 * 4);
            W.Prefix.Length = (long)local_80 + uVar11;
            HashOffset = (long)&(local_88.twine)->LHS + uVar11;
            uVar7 = DataExtractor::getU32
                              ((DataExtractor *)local_50.twine,&W.Prefix.Length,(Error *)0x0);
            if (uVar7 % (this->Hdr).BucketCount != (uint)local_58) break;
            uVar8 = DataExtractor::getU32((DataExtractor *)local_50.twine,&HashOffset,(Error *)0x0);
            BucketScope.W = (ScopedPrinter *)(ulong)uVar8;
            Twine::Twine((Twine *)&Offset,"Hash 0x");
            OffsetsOffset = (uint64_t)uVar7;
            Twine::Twine((Twine *)&HashScope,(Twine *)&OffsetsOffset,UHexKind,(Child)0x0,EmptyKind);
            if ((local_60 == NullKind) || (local_e0 == NullKind)) {
              local_48.twine = (Twine *)0x0;
              uStack_40 = (Form *)0x0;
              local_38 = CONCAT62(local_38._2_6_,0x100);
            }
            else {
              if (local_60 == EmptyKind) {
                local_38 = CONCAT62(uStack_de,CONCAT11(NStack_df,local_e0));
                local_48.decUI = HashScope.W._0_4_;
                local_48._4_4_ = HashScope.W._4_4_;
                uVar13 = (uint)AtomsScope.W;
                uVar14 = AtomsScope.W._4_4_;
              }
              else {
                if (local_e0 != EmptyKind) {
                  NVar5 = local_60;
                  if (NStack_5f != EmptyKind) {
                    NVar5 = TwineKind;
                  }
                  LHS_01._4_4_ = Offset._4_4_;
                  LHS_01.decUI = (undefined4)Offset;
                  if (NStack_5f != EmptyKind) {
                    LHS_01.twine = (Twine *)&Offset;
                  }
                  RHSKind = local_e0;
                  if (NStack_df != EmptyKind) {
                    RHSKind = TwineKind;
                  }
                  RHS._4_4_ = HashScope.W._4_4_;
                  RHS.decUI = HashScope.W._0_4_;
                  if (NStack_df != EmptyKind) {
                    RHS.twine = (Twine *)&HashScope;
                  }
                  Twine::Twine((Twine *)&local_48,LHS_01,NVar5,RHS,RHSKind);
                  goto LAB_00d495d1;
                }
                local_38 = CONCAT62(uStack_5e,CONCAT11(NStack_5f,local_60));
                local_48.decUI = (undefined4)Offset;
                local_48._4_4_ = Offset._4_4_;
                uVar13 = CStack_68.decUI;
                uVar14 = CStack_68._4_4_;
              }
              uStack_40 = (Form *)CONCAT44(uVar14,uVar13);
            }
LAB_00d495d1:
            Twine::str_abi_cxx11_((string *)local_d8,(Twine *)&local_48);
            N_01.Data._2_6_ = local_d8._2_6_;
            N_01.Data._0_2_ = local_d8._0_2_;
            N_01.Length = local_d8._8_8_;
            DelimitedScope<'[',_']'>::DelimitedScope
                      ((DelimitedScope<_[_,__]_> *)&DataOffset,pSVar1,N_01);
            if ((undefined1 *)CONCAT62(local_d8._2_6_,local_d8._0_2_) != local_d8 + 0x10) {
              operator_delete((undefined1 *)CONCAT62(local_d8._2_6_,local_d8._0_2_),
                              local_d8._16_8_ + 1);
            }
            if (BucketScope.W <
                (ScopedPrinter *)
                (this->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor.Data.Length) {
              do {
                bVar6 = dumpName(this,pSVar1,(SmallVectorImpl<llvm::DWARFFormValue> *)local_1e8,
                                 (uint64_t *)&BucketScope);
              } while (bVar6);
            }
            else {
              Value.Length = 0x16;
              Value.Data = "Invalid section offset";
              ScopedPrinter::printString(pSVar1,Value);
            }
            DelimitedScope<'[',_']'>::~DelimitedScope((DelimitedScope<_[_,__]_> *)&DataOffset);
            uVar12 = uVar12 + 1;
          } while (uVar12 < (this->Hdr).HashCount);
        }
        DelimitedScope<'[',_']'>::~DelimitedScope(&local_108);
        uVar9 = (int)local_58 + 1;
        local_58 = (void *)(ulong)uVar9;
      } while (uVar9 < (this->Hdr).BucketCount);
    }
    if (local_1e8 !=
        (undefined1  [8])
        &AtomForms.super_SmallVectorImpl<llvm::DWARFFormValue>.
         super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
         super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size) {
      free((void *)local_1e8);
    }
  }
  return;
}

Assistant:

LLVM_DUMP_METHOD void AppleAcceleratorTable::dump(raw_ostream &OS) const {
  if (!IsValid)
    return;

  ScopedPrinter W(OS);

  Hdr.dump(W);

  W.printNumber("DIE offset base", HdrData.DIEOffsetBase);
  W.printNumber("Number of atoms", uint64_t(HdrData.Atoms.size()));
  SmallVector<DWARFFormValue, 3> AtomForms;
  {
    ListScope AtomsScope(W, "Atoms");
    unsigned i = 0;
    for (const auto &Atom : HdrData.Atoms) {
      DictScope AtomScope(W, ("Atom " + Twine(i++)).str());
      W.startLine() << "Type: " << formatAtom(Atom.first) << '\n';
      W.startLine() << "Form: " << formatv("{0}", Atom.second) << '\n';
      AtomForms.push_back(DWARFFormValue(Atom.second));
    }
  }

  // Now go through the actual tables and dump them.
  uint64_t Offset = sizeof(Hdr) + Hdr.HeaderDataLength;
  uint64_t HashesBase = Offset + Hdr.BucketCount * 4;
  uint64_t OffsetsBase = HashesBase + Hdr.HashCount * 4;

  for (unsigned Bucket = 0; Bucket < Hdr.BucketCount; ++Bucket) {
    unsigned Index = AccelSection.getU32(&Offset);

    ListScope BucketScope(W, ("Bucket " + Twine(Bucket)).str());
    if (Index == UINT32_MAX) {
      W.printString("EMPTY");
      continue;
    }

    for (unsigned HashIdx = Index; HashIdx < Hdr.HashCount; ++HashIdx) {
      uint64_t HashOffset = HashesBase + HashIdx*4;
      uint64_t OffsetsOffset = OffsetsBase + HashIdx*4;
      uint32_t Hash = AccelSection.getU32(&HashOffset);

      if (Hash % Hdr.BucketCount != Bucket)
        break;

      uint64_t DataOffset = AccelSection.getU32(&OffsetsOffset);
      ListScope HashScope(W, ("Hash 0x" + Twine::utohexstr(Hash)).str());
      if (!AccelSection.isValidOffset(DataOffset)) {
        W.printString("Invalid section offset");
        continue;
      }
      while (dumpName(W, AtomForms, &DataOffset))
        /*empty*/;
    }
  }
}